

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFMatrixRef.h
# Opt level: O0

void __thiscall
TPZFMatrixRef<long_double>::TPZFMatrixRef
          (TPZFMatrixRef<long_double> *this,int64_t rows,longdouble **buf)

{
  undefined8 in_RDX;
  undefined8 *in_RDI;
  int64_t in_stack_00000028;
  int64_t in_stack_00000030;
  void **in_stack_00000038;
  TPZFMatrix<long_double> *in_stack_00000040;
  
  TPZFMatrix<long_double>::TPZFMatrix
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
             (longdouble *)this,rows);
  *in_RDI = &PTR__TPZFMatrixRef_02404a98;
  in_RDI[0x12] = in_RDX;
  return;
}

Assistant:

TPZFMatrixRef(const int64_t rows, TVar * &buf) :
    TPZFMatrix<TVar>(rows,1,buf,rows), fOrigRef(buf) {}